

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

int __thiscall
google::protobuf::io::anon_unknown_0::IoTest::WriteStuff(IoTest *this,ZeroCopyOutputStream *output)

{
  int iVar1;
  undefined4 extraout_var;
  string *str;
  string *str_00;
  string *str_01;
  string *str_02;
  string *str_03;
  string *str_04;
  char *message;
  AssertionResult gtest_ar;
  ZeroCopyOutputStream local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _func_int *local_30 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  AssertHelper local_18;
  
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Hello world!\n","");
  WriteString(this,&local_40,str);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Some te","");
  WriteString(this,&local_40,str_00);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"xt.  Blah blah.","");
  WriteString(this,&local_40,str_01);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"abcdefg","");
  WriteString(this,&local_40,str_02);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"01234567890123456789","");
  WriteString(this,&local_40,str_03);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  local_40._vptr_ZeroCopyOutputStream = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"foobar","");
  WriteString(this,&local_40,str_04);
  if (local_40._vptr_ZeroCopyOutputStream != local_30) {
    operator_delete(local_40._vptr_ZeroCopyOutputStream,(ulong)(local_30[0] + 1));
  }
  iVar1 = (*(this->super_Test)._vptr_Test[4])(this);
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(extraout_var,iVar1);
  local_18.data_._0_4_ = 0x44;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_40,"output->ByteCount()","68",(long *)&local_20,(int *)&local_18);
  if (local_40._vptr_ZeroCopyOutputStream._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0xd9,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  iVar1 = (*(this->super_Test)._vptr_Test[4])(this);
  return iVar1;
}

Assistant:

int IoTest::WriteStuff(ZeroCopyOutputStream* output) {
  WriteString(output, "Hello world!\n");
  WriteString(output, "Some te");
  WriteString(output, "xt.  Blah blah.");
  WriteString(output, "abcdefg");
  WriteString(output, "01234567890123456789");
  WriteString(output, "foobar");

  EXPECT_EQ(output->ByteCount(), 68);

  int result = output->ByteCount();
  return result;
}